

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_fp.h
# Opt level: O0

void ncnn::innerproduct_transform_kernel_fp16s_sse
               (Mat *weight_data,Mat *weight_data_tm,int num_input,int num_output,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 *puVar8;
  unsigned_short uVar9;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  long in_R8;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  Mat weight_data_r2_2;
  __m128i _r23_fp16;
  __m128i _r01_fp16;
  __m256 _r23;
  __m256 _r01;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _r3_1;
  __m128 _r2_1;
  __m128 _r1_1;
  __m128 _r0_1;
  int p_1;
  float *k3_1;
  float *k2_1;
  float *k1_1;
  float *k0_1;
  unsigned_short *g0_1;
  int q_1;
  Mat weight_data_r2_1;
  __m128i _r7;
  __m128i _r6;
  __m128i _r5;
  __m128i _r4;
  __m128i _r3;
  __m128i _r2;
  __m128i _r1;
  __m128i _r0;
  int p;
  float *k7;
  float *k6;
  float *k5;
  float *k4;
  float *k3;
  float *k2;
  float *k1;
  float *k0;
  unsigned_short *g0;
  int q;
  Mat weight_data_r2;
  int out_elempack;
  __m128i _tmpf;
  __m128i _tmpe;
  __m128i _tmpd;
  __m128i _tmpc;
  __m128i _tmpb;
  __m128i _tmpa;
  __m128i _tmp9;
  __m128i _tmp8;
  __m128i _tmp7;
  __m128i _tmp6;
  __m128i _tmp5;
  __m128i _tmp4;
  __m128i _tmp3;
  __m128i _tmp2;
  __m128i _tmp1;
  __m128i _tmp0;
  Allocator *in_stack_fffffffffffff3d8;
  void **ppvVar13;
  int in_stack_fffffffffffff3e4;
  size_t in_stack_fffffffffffff3e8;
  undefined8 in_stack_fffffffffffff3f0;
  Mat *in_stack_fffffffffffff3f8;
  Mat *in_stack_fffffffffffff400;
  unsigned_short in_stack_fffffffffffff408;
  unsigned_short in_stack_fffffffffffff40a;
  unsigned_short in_stack_fffffffffffff40c;
  unsigned_short in_stack_fffffffffffff40e;
  int local_bcc;
  void *local_bc8;
  Allocator *in_stack_fffffffffffff440;
  int in_stack_fffffffffffff448;
  int in_stack_fffffffffffff44c;
  Mat *in_stack_fffffffffffff450;
  long *local_ba8;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 local_af0;
  undefined8 uStack_ae8;
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  int local_a9c;
  undefined1 (*local_a98) [16];
  undefined1 (*local_a90) [16];
  undefined1 (*local_a88) [16];
  undefined1 (*local_a80) [16];
  unsigned_short *local_a78;
  int local_a6c;
  void *local_a68;
  int *local_a60;
  long local_a58;
  long *local_a48;
  int local_a3c;
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  int local_99c;
  undefined1 (*local_998) [32];
  undefined1 (*local_990) [32];
  undefined1 (*local_988) [32];
  undefined1 (*local_980) [32];
  undefined1 (*local_978) [32];
  undefined1 (*local_970) [32];
  undefined1 (*local_968) [32];
  undefined1 (*local_960) [32];
  unsigned_short *local_958;
  int local_950;
  Mat local_940;
  int local_8f4;
  int local_8e8;
  int local_8e4;
  long *local_8e0;
  undefined1 (*local_8d0) [32];
  undefined1 (*local_8c8) [32];
  undefined1 (*local_8c0) [32];
  undefined1 (*local_8b8) [32];
  undefined1 (*local_8b0) [32];
  undefined1 (*local_8a8) [32];
  undefined1 (*local_8a0) [32];
  undefined1 (*local_898) [32];
  undefined1 (*local_890) [16];
  undefined1 (*local_888) [16];
  undefined1 (*local_880) [16];
  undefined1 (*local_878) [16];
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  int local_74c;
  void **local_748;
  int local_73c;
  void **local_738;
  int local_72c;
  void **local_728;
  int local_71c;
  void **local_718;
  int local_70c;
  Mat *local_708;
  int local_6fc;
  Mat *local_6f8;
  int local_6ec;
  Mat *local_6e8;
  int local_6dc;
  Mat *local_6d8;
  int local_6cc;
  Mat *local_6c8;
  int local_6bc;
  Mat *local_6b8;
  int local_6ac;
  Mat *local_6a8;
  int local_69c;
  Mat *local_698;
  int local_68c;
  long *local_688;
  int local_67c;
  long *local_678;
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined1 (*local_518) [16];
  undefined8 local_510;
  undefined8 uStack_508;
  unsigned_short *local_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined1 (*local_4d8) [16];
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  unsigned_short *local_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  unsigned_short *local_498;
  undefined8 local_490;
  undefined8 uStack_488;
  unsigned_short *local_478;
  undefined8 local_470;
  undefined8 uStack_468;
  unsigned_short *local_458;
  undefined8 local_450;
  undefined8 uStack_448;
  unsigned_short *local_438;
  undefined8 local_430;
  undefined8 uStack_428;
  unsigned_short *local_418;
  undefined8 local_410;
  undefined8 uStack_408;
  unsigned_short *local_3f8;
  Mat *local_3f0;
  void **local_3e0;
  void **local_3d0;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  int local_b0;
  undefined4 local_ac;
  void **local_a8;
  int local_90;
  undefined4 local_8c;
  void **local_88;
  int local_70;
  undefined4 local_6c;
  Mat *local_68;
  
  local_8f4 = 1;
  if ((*(byte *)(in_R8 + 0x27) & 1) != 0) {
    if (in_ECX % 8 == 0) {
      local_bcc = 8;
    }
    else {
      local_bcc = 1;
      if (in_ECX % 4 == 0) {
        local_bcc = 4;
      }
    }
    local_8f4 = local_bcc;
  }
  local_8e8 = in_ECX;
  local_8e4 = in_EDX;
  local_8e0 = in_RSI;
  if (local_8f4 == 8) {
    Mat::reshape(in_stack_fffffffffffff450,in_stack_fffffffffffff44c,in_stack_fffffffffffff448,
                 in_stack_fffffffffffff440);
    Mat::create(in_stack_fffffffffffff3f8,(int)((ulong)in_stack_fffffffffffff3f0 >> 0x20),
                (int)in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e4,
                in_stack_fffffffffffff3d8);
    for (local_950 = 0; local_950 + 7 < local_8e8; local_950 = local_950 + 8) {
      local_67c = local_950 / 8;
      local_678 = local_8e0;
      local_958 = (unsigned_short *)
                  (*local_8e0 +
                  (long)*(int *)((long)local_8e0 + 0x2c) * (long)local_67c * local_8e0[2]);
      local_698 = &local_940;
      local_69c = local_950;
      local_960 = (undefined1 (*) [32])
                  ((long)local_940.data + (long)local_940.w * (long)local_950 * local_940.elemsize);
      local_6ac = local_950 + 1;
      local_6a8 = &local_940;
      local_968 = (undefined1 (*) [32])
                  ((long)local_940.data + (long)local_940.w * (long)local_6ac * local_940.elemsize);
      local_6bc = local_950 + 2;
      local_6b8 = &local_940;
      local_970 = (undefined1 (*) [32])
                  ((long)local_940.data + (long)local_940.w * (long)local_6bc * local_940.elemsize);
      local_6cc = local_950 + 3;
      local_6c8 = &local_940;
      local_978 = (undefined1 (*) [32])
                  ((long)local_940.data + (long)local_940.w * (long)local_6cc * local_940.elemsize);
      local_6dc = local_950 + 4;
      local_6d8 = &local_940;
      local_980 = (undefined1 (*) [32])
                  ((long)local_940.data + (long)local_940.w * (long)local_6dc * local_940.elemsize);
      local_6ec = local_950 + 5;
      local_6e8 = &local_940;
      local_988 = (undefined1 (*) [32])
                  ((long)local_940.data + (long)local_940.w * (long)local_6ec * local_940.elemsize);
      local_6fc = local_950 + 6;
      local_6f8 = &local_940;
      local_990 = (undefined1 (*) [32])
                  ((long)local_940.data + (long)local_940.w * (long)local_6fc * local_940.elemsize);
      local_70c = local_950 + 7;
      local_708 = &local_940;
      local_998 = (undefined1 (*) [32])
                  ((long)local_940.data + (long)local_940.w * (long)local_70c * local_940.elemsize);
      for (local_99c = 0; local_99c + 7 < local_8e4; local_99c = local_99c + 8) {
        local_898 = local_960;
        auVar10 = vcvtps2ph_f16c(*local_960,3);
        local_8a0 = local_968;
        auVar11 = vcvtps2ph_f16c(*local_968,3);
        local_8a8 = local_970;
        auVar1 = vcvtps2ph_f16c(*local_970,3);
        local_8b0 = local_978;
        auVar2 = vcvtps2ph_f16c(*local_978,3);
        local_8b8 = local_980;
        auVar3 = vcvtps2ph_f16c(*local_980,3);
        local_8c0 = local_988;
        auVar4 = vcvtps2ph_f16c(*local_988,3);
        local_8c8 = local_990;
        auVar5 = vcvtps2ph_f16c(*local_990,3);
        local_8d0 = local_998;
        auVar6 = vcvtps2ph_f16c(*local_998,3);
        local_538 = local_9b0;
        local_540 = local_9c0;
        local_548 = local_9d0;
        local_550 = local_9e0;
        local_558 = local_9f0;
        local_560 = local_a00;
        local_568 = local_a10;
        local_570 = local_a20;
        local_9b0._0_8_ = auVar10._0_8_;
        local_350 = local_9b0._0_8_;
        local_9b0._8_8_ = auVar10._8_8_;
        uStack_348 = local_9b0._8_8_;
        local_9c0._0_8_ = auVar11._0_8_;
        local_360 = local_9c0._0_8_;
        local_9c0._8_8_ = auVar11._8_8_;
        uStack_358 = local_9c0._8_8_;
        local_580 = vpunpcklwd_avx(auVar10,auVar11);
        local_2d0 = local_9b0._0_8_;
        uStack_2c8 = local_9b0._8_8_;
        local_2e0 = local_9c0._0_8_;
        uStack_2d8 = local_9c0._8_8_;
        local_590 = vpunpckhwd_avx(auVar10,auVar11);
        local_9d0._0_8_ = auVar1._0_8_;
        local_370 = local_9d0._0_8_;
        local_9d0._8_8_ = auVar1._8_8_;
        uStack_368 = local_9d0._8_8_;
        local_9e0._0_8_ = auVar2._0_8_;
        local_380 = local_9e0._0_8_;
        local_9e0._8_8_ = auVar2._8_8_;
        uStack_378 = local_9e0._8_8_;
        local_5a0 = vpunpcklwd_avx(auVar1,auVar2);
        local_2f0 = local_9d0._0_8_;
        uStack_2e8 = local_9d0._8_8_;
        local_300 = local_9e0._0_8_;
        uStack_2f8 = local_9e0._8_8_;
        local_5b0 = vpunpckhwd_avx(auVar1,auVar2);
        local_9f0._0_8_ = auVar3._0_8_;
        local_390 = local_9f0._0_8_;
        local_9f0._8_8_ = auVar3._8_8_;
        uStack_388 = local_9f0._8_8_;
        local_a00._0_8_ = auVar4._0_8_;
        local_3a0 = local_a00._0_8_;
        local_a00._8_8_ = auVar4._8_8_;
        uStack_398 = local_a00._8_8_;
        local_5c0 = vpunpcklwd_avx(auVar3,auVar4);
        local_310 = local_9f0._0_8_;
        uStack_308 = local_9f0._8_8_;
        local_320 = local_a00._0_8_;
        uStack_318 = local_a00._8_8_;
        local_5d0 = vpunpckhwd_avx(auVar3,auVar4);
        local_a10._0_8_ = auVar5._0_8_;
        local_3b0 = local_a10._0_8_;
        local_a10._8_8_ = auVar5._8_8_;
        uStack_3a8 = local_a10._8_8_;
        local_a20._0_8_ = auVar6._0_8_;
        local_3c0 = local_a20._0_8_;
        local_a20._8_8_ = auVar6._8_8_;
        uStack_3b8 = local_a20._8_8_;
        local_5e0 = vpunpcklwd_avx(auVar5,auVar6);
        local_330 = local_a10._0_8_;
        uStack_328 = local_a10._8_8_;
        local_340 = local_a20._0_8_;
        uStack_338 = local_a20._8_8_;
        local_5f0 = vpunpckhwd_avx(auVar5,auVar6);
        local_250 = local_580._0_8_;
        uStack_248 = local_580._8_8_;
        local_260 = local_5a0._0_8_;
        uStack_258 = local_5a0._8_8_;
        local_600 = vpunpckldq_avx(local_580,local_5a0);
        local_1d0 = local_580._0_8_;
        uStack_1c8 = local_580._8_8_;
        local_1e0 = local_5a0._0_8_;
        uStack_1d8 = local_5a0._8_8_;
        local_610 = vpunpckhdq_avx(local_580,local_5a0);
        local_270 = local_590._0_8_;
        uStack_268 = local_590._8_8_;
        local_280 = local_5b0._0_8_;
        uStack_278 = local_5b0._8_8_;
        local_620 = vpunpckldq_avx(local_590,local_5b0);
        local_1f0 = local_590._0_8_;
        uStack_1e8 = local_590._8_8_;
        local_200 = local_5b0._0_8_;
        uStack_1f8 = local_5b0._8_8_;
        local_630 = vpunpckhdq_avx(local_590,local_5b0);
        local_290 = local_5c0._0_8_;
        uStack_288 = local_5c0._8_8_;
        local_2a0 = local_5e0._0_8_;
        uStack_298 = local_5e0._8_8_;
        local_640 = vpunpckldq_avx(local_5c0,local_5e0);
        local_210 = local_5c0._0_8_;
        uStack_208 = local_5c0._8_8_;
        local_220 = local_5e0._0_8_;
        uStack_218 = local_5e0._8_8_;
        local_650 = vpunpckhdq_avx(local_5c0,local_5e0);
        local_2b0 = local_5d0._0_8_;
        uStack_2a8 = local_5d0._8_8_;
        local_2c0 = local_5f0._0_8_;
        uStack_2b8 = local_5f0._8_8_;
        local_660 = vpunpckldq_avx(local_5d0,local_5f0);
        local_230 = local_5d0._0_8_;
        uStack_228 = local_5d0._8_8_;
        local_240 = local_5f0._0_8_;
        uStack_238 = local_5f0._8_8_;
        local_670 = vpunpckhdq_avx(local_5d0,local_5f0);
        local_150 = local_600._0_8_;
        uStack_148 = local_600._8_8_;
        local_160 = local_640._0_8_;
        uStack_158 = local_640._8_8_;
        local_9b0 = vpunpcklqdq_avx(local_600,local_640);
        local_d0 = local_600._0_8_;
        uStack_c8 = local_600._8_8_;
        local_e0 = local_640._0_8_;
        uStack_d8 = local_640._8_8_;
        local_9c0 = vpunpckhqdq_avx(local_600,local_640);
        local_170 = local_610._0_8_;
        uStack_168 = local_610._8_8_;
        local_180 = local_650._0_8_;
        uStack_178 = local_650._8_8_;
        local_9d0 = vpunpcklqdq_avx(local_610,local_650);
        local_f0 = local_610._0_8_;
        uStack_e8 = local_610._8_8_;
        local_100 = local_650._0_8_;
        uStack_f8 = local_650._8_8_;
        local_9e0 = vpunpckhqdq_avx(local_610,local_650);
        local_190 = local_620._0_8_;
        uStack_188 = local_620._8_8_;
        local_1a0 = local_660._0_8_;
        uStack_198 = local_660._8_8_;
        local_9f0 = vpunpcklqdq_avx(local_620,local_660);
        local_110 = local_620._0_8_;
        uStack_108 = local_620._8_8_;
        local_120 = local_660._0_8_;
        uStack_118 = local_660._8_8_;
        local_a00 = vpunpckhqdq_avx(local_620,local_660);
        local_1b0 = local_630._0_8_;
        uStack_1a8 = local_630._8_8_;
        local_1c0 = local_670._0_8_;
        uStack_1b8 = local_670._8_8_;
        local_a10 = vpunpcklqdq_avx(local_630,local_670);
        local_130 = local_630._0_8_;
        uStack_128 = local_630._8_8_;
        local_140 = local_670._0_8_;
        uStack_138 = local_670._8_8_;
        local_a20 = vpunpckhqdq_avx(local_630,local_670);
        local_3f8 = local_958;
        local_410 = local_9b0._0_8_;
        uStack_408 = local_9b0._8_8_;
        *(undefined8 *)local_958 = local_9b0._0_8_;
        *(undefined8 *)(local_958 + 4) = local_9b0._8_8_;
        local_418 = local_958 + 8;
        local_430 = local_9c0._0_8_;
        uStack_428 = local_9c0._8_8_;
        *(undefined8 *)local_418 = local_9c0._0_8_;
        *(undefined8 *)(local_958 + 0xc) = local_9c0._8_8_;
        local_438 = local_958 + 0x10;
        local_450 = local_9d0._0_8_;
        uStack_448 = local_9d0._8_8_;
        *(undefined8 *)local_438 = local_9d0._0_8_;
        *(undefined8 *)(local_958 + 0x14) = local_9d0._8_8_;
        local_458 = local_958 + 0x18;
        local_470 = local_9e0._0_8_;
        uStack_468 = local_9e0._8_8_;
        *(undefined8 *)local_458 = local_9e0._0_8_;
        *(undefined8 *)(local_958 + 0x1c) = local_9e0._8_8_;
        local_478 = local_958 + 0x20;
        local_490 = local_9f0._0_8_;
        uStack_488 = local_9f0._8_8_;
        *(undefined8 *)local_478 = local_9f0._0_8_;
        *(undefined8 *)(local_958 + 0x24) = local_9f0._8_8_;
        local_498 = local_958 + 0x28;
        local_4b0 = local_a00._0_8_;
        uStack_4a8 = local_a00._8_8_;
        *(undefined8 *)local_498 = local_a00._0_8_;
        *(undefined8 *)(local_958 + 0x2c) = local_a00._8_8_;
        local_4b8 = local_958 + 0x30;
        local_4d0 = local_a10._0_8_;
        uStack_4c8 = local_a10._8_8_;
        *(undefined8 *)local_4b8 = local_a10._0_8_;
        *(undefined8 *)(local_958 + 0x34) = local_a10._8_8_;
        local_4d8 = (undefined1 (*) [16])(local_958 + 0x38);
        local_4f0 = local_a20._0_8_;
        uStack_4e8 = local_a20._8_8_;
        *local_4d8 = local_a20;
        local_960 = local_960 + 1;
        local_968 = local_968 + 1;
        local_970 = local_970 + 1;
        local_978 = local_978 + 1;
        local_980 = local_980 + 1;
        local_988 = local_988 + 1;
        local_990 = local_990 + 1;
        local_998 = local_998 + 1;
        local_958 = local_958 + 0x40;
      }
      for (; local_99c < local_8e4; local_99c = local_99c + 1) {
        puVar8 = *local_960;
        local_960 = (undefined1 (*) [32])(*local_960 + 4);
        uVar9 = float32_to_float16(*(float *)puVar8);
        *local_958 = uVar9;
        puVar8 = *local_968;
        local_968 = (undefined1 (*) [32])(*local_968 + 4);
        uVar9 = float32_to_float16(*(float *)puVar8);
        local_958[1] = uVar9;
        puVar8 = *local_970;
        local_970 = (undefined1 (*) [32])(*local_970 + 4);
        uVar9 = float32_to_float16(*(float *)puVar8);
        local_958[2] = uVar9;
        puVar8 = *local_978;
        local_978 = (undefined1 (*) [32])(*local_978 + 4);
        uVar9 = float32_to_float16(*(float *)puVar8);
        local_958[3] = uVar9;
        puVar8 = *local_980;
        local_980 = (undefined1 (*) [32])(*local_980 + 4);
        in_stack_fffffffffffff40e = float32_to_float16(*(float *)puVar8);
        local_958[4] = in_stack_fffffffffffff40e;
        puVar8 = *local_988;
        local_988 = (undefined1 (*) [32])(*local_988 + 4);
        in_stack_fffffffffffff40c = float32_to_float16(*(float *)puVar8);
        local_958[5] = in_stack_fffffffffffff40c;
        puVar8 = *local_990;
        local_990 = (undefined1 (*) [32])(*local_990 + 4);
        in_stack_fffffffffffff40a = float32_to_float16(*(float *)puVar8);
        local_958[6] = in_stack_fffffffffffff40a;
        puVar8 = *local_998;
        local_998 = (undefined1 (*) [32])(*local_998 + 4);
        in_stack_fffffffffffff408 = float32_to_float16(*(float *)puVar8);
        local_958[7] = in_stack_fffffffffffff408;
        local_958 = local_958 + 8;
      }
    }
    in_stack_fffffffffffff400 = &local_940;
    local_3f0 = in_stack_fffffffffffff400;
    local_68 = in_stack_fffffffffffff400;
    if (local_940.refcount != (int *)0x0) {
      local_6c = 0xffffffff;
      LOCK();
      local_70 = *local_940.refcount;
      *local_940.refcount = *local_940.refcount + -1;
      UNLOCK();
      if (local_70 == 1) {
        if (local_940.allocator == (Allocator *)0x0) {
          if (local_940.data != (void *)0x0) {
            free(local_940.data);
          }
        }
        else {
          (*(local_940.allocator)->_vptr_Allocator[3])(local_940.allocator,local_940.data);
        }
      }
    }
    in_stack_fffffffffffff400->data = (void *)0x0;
    in_stack_fffffffffffff400->elemsize = 0;
    in_stack_fffffffffffff400->elempack = 0;
    in_stack_fffffffffffff400->dims = 0;
    in_stack_fffffffffffff400->w = 0;
    in_stack_fffffffffffff400->h = 0;
    in_stack_fffffffffffff400->d = 0;
    in_stack_fffffffffffff400->c = 0;
    in_stack_fffffffffffff400->cstep = 0;
    in_stack_fffffffffffff400->refcount = (int *)0x0;
  }
  if (local_8f4 == 4) {
    in_stack_fffffffffffff3f8 = (Mat *)0x0;
    Mat::reshape(in_stack_fffffffffffff450,in_stack_fffffffffffff44c,in_stack_fffffffffffff448,
                 in_stack_fffffffffffff440);
    Mat::create(in_stack_fffffffffffff3f8,(int)((ulong)in_stack_fffffffffffff3f0 >> 0x20),
                (int)in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e4,
                in_stack_fffffffffffff3d8);
    for (local_a6c = 0; local_a6c + 3 < local_8e8; local_a6c = local_a6c + 4) {
      local_68c = local_a6c / 4;
      local_688 = local_8e0;
      local_a78 = (unsigned_short *)
                  (*local_8e0 +
                  (long)*(int *)((long)local_8e0 + 0x2c) * (long)local_68c * local_8e0[2]);
      local_718 = &local_a68;
      local_71c = local_a6c;
      local_a80 = (undefined1 (*) [16])
                  ((long)local_a68 + (long)local_a3c * (long)local_a6c * local_a58);
      local_72c = local_a6c + 1;
      local_728 = &local_a68;
      local_a88 = (undefined1 (*) [16])
                  ((long)local_a68 + (long)local_a3c * (long)local_72c * local_a58);
      local_73c = local_a6c + 2;
      local_738 = &local_a68;
      local_a90 = (undefined1 (*) [16])
                  ((long)local_a68 + (long)local_a3c * (long)local_73c * local_a58);
      local_74c = local_a6c + 3;
      local_748 = &local_a68;
      local_a98 = (undefined1 (*) [16])
                  ((long)local_a68 + (long)local_a3c * (long)local_74c * local_a58);
      for (local_a9c = 0; local_a9c + 3 < local_8e4; local_a9c = local_a9c + 4) {
        local_878 = local_a80;
        local_820 = *(undefined8 *)*local_a80;
        uStack_818 = *(undefined8 *)(*local_a80 + 8);
        local_880 = local_a88;
        local_830 = *(undefined8 *)*local_a88;
        uStack_828 = *(undefined8 *)(*local_a88 + 8);
        local_888 = local_a90;
        local_840 = *(undefined8 *)*local_a90;
        uStack_838 = *(undefined8 *)(*local_a90 + 8);
        local_890 = local_a98;
        local_850 = *(undefined8 *)*local_a98;
        uStack_848 = *(undefined8 *)(*local_a98 + 8);
        auVar10 = vunpcklps_avx(*local_a80,*local_a88);
        auVar3 = vunpcklps_avx(*local_a90,*local_a98);
        auVar11 = vunpckhps_avx(*local_a80,*local_a88);
        auVar1 = vunpckhps_avx(*local_a90,*local_a98);
        local_b20 = auVar10._0_8_;
        local_7a0 = local_b20;
        uStack_b18 = auVar10._8_8_;
        uStack_798 = uStack_b18;
        local_b00 = auVar3._0_8_;
        local_7b0 = local_b00;
        uStack_af8 = auVar3._8_8_;
        uStack_7a8 = uStack_af8;
        auVar2 = vunpcklpd_avx(auVar10,auVar3);
        local_760 = local_b00;
        uStack_758 = uStack_af8;
        local_770 = local_b20;
        uStack_768 = uStack_b18;
        auVar10 = vunpckhpd_avx(auVar10,auVar3);
        local_b10 = auVar11._0_8_;
        local_7c0 = local_b10;
        uStack_b08 = auVar11._8_8_;
        uStack_7b8 = uStack_b08;
        local_af0 = auVar1._0_8_;
        local_7d0 = local_af0;
        uStack_ae8 = auVar1._8_8_;
        uStack_7c8 = uStack_ae8;
        auVar3 = vunpcklpd_avx(auVar11,auVar1);
        local_780 = local_af0;
        uStack_778 = uStack_ae8;
        local_790 = local_b10;
        uStack_788 = uStack_b08;
        auVar11 = vunpckhpd_avx(auVar11,auVar1);
        local_ab0 = auVar2._0_8_;
        local_860 = local_ab0;
        uStack_aa8 = auVar2._8_8_;
        uStack_858 = uStack_aa8;
        local_ac0 = auVar10._0_8_;
        uStack_ab8 = auVar10._8_8_;
        local_ad0 = auVar3._0_8_;
        local_870 = local_ad0;
        uStack_ac8 = auVar3._8_8_;
        uStack_868 = uStack_ac8;
        auVar12._16_16_ = auVar11;
        auVar12._0_16_ = auVar3;
        auVar7._16_8_ = local_ac0;
        auVar7._0_16_ = auVar2;
        auVar7._24_8_ = uStack_ab8;
        auVar10 = vcvtps2ph_f16c(auVar7,3);
        auVar11 = vcvtps2ph_f16c(auVar12,3);
        local_4f8 = local_a78;
        local_b70 = auVar10._0_8_;
        local_510 = local_b70;
        uStack_b68 = auVar10._8_8_;
        uStack_508 = uStack_b68;
        *(undefined8 *)local_a78 = local_b70;
        *(undefined8 *)(local_a78 + 4) = uStack_b68;
        local_518 = (undefined1 (*) [16])(local_a78 + 8);
        local_b80 = auVar11._0_8_;
        local_530 = local_b80;
        uStack_b78 = auVar11._8_8_;
        uStack_528 = uStack_b78;
        *local_518 = auVar11;
        local_a80 = local_a80 + 1;
        local_a88 = local_a88 + 1;
        local_a90 = local_a90 + 1;
        local_a98 = local_a98 + 1;
        local_a78 = local_a78 + 0x10;
        local_810 = local_850;
        uStack_808 = uStack_848;
        local_800 = local_840;
        uStack_7f8 = uStack_838;
        local_7f0 = local_830;
        uStack_7e8 = uStack_828;
        local_7e0 = local_820;
        uStack_7d8 = uStack_818;
      }
      for (; local_a9c < local_8e4; local_a9c = local_a9c + 1) {
        uVar9 = float32_to_float16(*(float *)*local_a80);
        *local_a78 = uVar9;
        uVar9 = float32_to_float16(*(float *)*local_a88);
        local_a78[1] = uVar9;
        uVar9 = float32_to_float16(*(float *)*local_a90);
        local_a78[2] = uVar9;
        uVar9 = float32_to_float16(*(float *)*local_a98);
        local_a78[3] = uVar9;
        local_a78 = local_a78 + 4;
        local_a98 = (undefined1 (*) [16])(*local_a98 + 4);
        local_a90 = (undefined1 (*) [16])(*local_a90 + 4);
        local_a88 = (undefined1 (*) [16])(*local_a88 + 4);
        local_a80 = (undefined1 (*) [16])(*local_a80 + 4);
      }
    }
    ppvVar13 = &local_a68;
    local_3e0 = ppvVar13;
    local_88 = ppvVar13;
    if (local_a60 != (int *)0x0) {
      local_8c = 0xffffffff;
      LOCK();
      local_90 = *local_a60;
      *local_a60 = *local_a60 + -1;
      UNLOCK();
      if (local_90 == 1) {
        if (local_a48 == (long *)0x0) {
          if (local_a68 != (void *)0x0) {
            free(local_a68);
          }
        }
        else {
          (**(code **)(*local_a48 + 0x18))(local_a48,local_a68);
        }
      }
    }
    *ppvVar13 = (void *)0x0;
    ppvVar13[2] = (void *)0x0;
    *(undefined4 *)(ppvVar13 + 3) = 0;
    *(undefined4 *)(ppvVar13 + 5) = 0;
    *(undefined4 *)((long)ppvVar13 + 0x2c) = 0;
    *(undefined4 *)(ppvVar13 + 6) = 0;
    *(undefined4 *)((long)ppvVar13 + 0x34) = 0;
    *(undefined4 *)(ppvVar13 + 7) = 0;
    ppvVar13[8] = (void *)0x0;
    ppvVar13[1] = (void *)0x0;
  }
  if (local_8f4 == 1) {
    Mat::reshape(in_stack_fffffffffffff450,in_stack_fffffffffffff44c,in_stack_fffffffffffff448,
                 in_stack_fffffffffffff440);
    cast_float32_to_float16
              ((Mat *)CONCAT26(in_stack_fffffffffffff40e,
                               CONCAT24(in_stack_fffffffffffff40c,
                                        CONCAT22(in_stack_fffffffffffff40a,in_stack_fffffffffffff408
                                                ))),in_stack_fffffffffffff400,
               (Option *)in_stack_fffffffffffff3f8);
    local_3d0 = &local_bc8;
    if (in_stack_fffffffffffff440 != (Allocator *)0x0) {
      local_ac = 0xffffffff;
      LOCK();
      local_b0 = *(int *)&in_stack_fffffffffffff440->_vptr_Allocator;
      *(int *)&in_stack_fffffffffffff440->_vptr_Allocator =
           *(int *)&in_stack_fffffffffffff440->_vptr_Allocator + -1;
      UNLOCK();
      if (local_b0 == 1) {
        local_a8 = local_3d0;
        if (local_ba8 == (long *)0x0) {
          if (local_bc8 != (void *)0x0) {
            free(local_bc8);
          }
        }
        else {
          (**(code **)(*local_ba8 + 0x18))(local_ba8,local_bc8);
        }
      }
    }
  }
  return;
}

Assistant:

static void innerproduct_transform_kernel_sse(const Mat& weight_data, Mat& weight_data_tm, int num_input, int num_output, const Option& opt)
#endif
{
#if NCNN_RUNTIME_CPU && NCNN_IMPL_FP16S && NCNN_F16C && __AVX__ && !__F16C__
    if (ncnn::cpu_support_x86_f16c())
    {
        innerproduct_transform_kernel_fp16s_sse_f16c(weight_data, weight_data_tm, num_input, num_output, opt);
        return;
    }
#else // NCNN_RUNTIME_CPU

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = inch-outch
    // dst = pb-inch-outch/pb
#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (out_elempack == 16)
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

#if NCNN_IMPL_FP16S
        weight_data_tm.create(num_input, num_output / 16, (size_t)32u, 16);
#else
        weight_data_tm.create(num_input, num_output / 16, (size_t)64u, 16);
#endif

        for (int q = 0; q + 15 < num_output; q += 16)
        {
#if NCNN_IMPL_FP16S
            unsigned short* g0 = weight_data_tm.row<unsigned short>(q / 16);
#else
            float* g0 = weight_data_tm.row(q / 16);
#endif

            const float* k0 = weight_data_r2.row(q);
            const float* k1 = weight_data_r2.row(q + 1);
            const float* k2 = weight_data_r2.row(q + 2);
            const float* k3 = weight_data_r2.row(q + 3);
            const float* k4 = weight_data_r2.row(q + 4);
            const float* k5 = weight_data_r2.row(q + 5);
            const float* k6 = weight_data_r2.row(q + 6);
            const float* k7 = weight_data_r2.row(q + 7);
            const float* k8 = weight_data_r2.row(q + 8);
            const float* k9 = weight_data_r2.row(q + 9);
            const float* ka = weight_data_r2.row(q + 10);
            const float* kb = weight_data_r2.row(q + 11);
            const float* kc = weight_data_r2.row(q + 12);
            const float* kd = weight_data_r2.row(q + 13);
            const float* ke = weight_data_r2.row(q + 14);
            const float* kf = weight_data_r2.row(q + 15);

            int p = 0;
            for (; p + 15 < num_input; p += 16)
            {
                // transpose 16x16
#if NCNN_IMPL_FP16S
                __m256i _r0 = _mm512_cvtps_ph(_mm512_loadu_ps(k0), _MM_FROUND_TRUNC);
                __m256i _r1 = _mm512_cvtps_ph(_mm512_loadu_ps(k1), _MM_FROUND_TRUNC);
                __m256i _r2 = _mm512_cvtps_ph(_mm512_loadu_ps(k2), _MM_FROUND_TRUNC);
                __m256i _r3 = _mm512_cvtps_ph(_mm512_loadu_ps(k3), _MM_FROUND_TRUNC);
                __m256i _r4 = _mm512_cvtps_ph(_mm512_loadu_ps(k4), _MM_FROUND_TRUNC);
                __m256i _r5 = _mm512_cvtps_ph(_mm512_loadu_ps(k5), _MM_FROUND_TRUNC);
                __m256i _r6 = _mm512_cvtps_ph(_mm512_loadu_ps(k6), _MM_FROUND_TRUNC);
                __m256i _r7 = _mm512_cvtps_ph(_mm512_loadu_ps(k7), _MM_FROUND_TRUNC);
                __m256i _r8 = _mm512_cvtps_ph(_mm512_loadu_ps(k8), _MM_FROUND_TRUNC);
                __m256i _r9 = _mm512_cvtps_ph(_mm512_loadu_ps(k9), _MM_FROUND_TRUNC);
                __m256i _ra = _mm512_cvtps_ph(_mm512_loadu_ps(ka), _MM_FROUND_TRUNC);
                __m256i _rb = _mm512_cvtps_ph(_mm512_loadu_ps(kb), _MM_FROUND_TRUNC);
                __m256i _rc = _mm512_cvtps_ph(_mm512_loadu_ps(kc), _MM_FROUND_TRUNC);
                __m256i _rd = _mm512_cvtps_ph(_mm512_loadu_ps(kd), _MM_FROUND_TRUNC);
                __m256i _re = _mm512_cvtps_ph(_mm512_loadu_ps(ke), _MM_FROUND_TRUNC);
                __m256i _rf = _mm512_cvtps_ph(_mm512_loadu_ps(kf), _MM_FROUND_TRUNC);

                transpose16x16_epi16(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);

                _mm256_storeu_si256((__m256i*)g0, _r0);
                _mm256_storeu_si256((__m256i*)(g0 + 16), _r1);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 2), _r2);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 3), _r3);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 4), _r4);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 5), _r5);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 6), _r6);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 7), _r7);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 8), _r8);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 9), _r9);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 10), _ra);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 11), _rb);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 12), _rc);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 13), _rd);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 14), _re);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 15), _rf);
#else
                __m512 _r0 = _mm512_loadu_ps(k0);
                __m512 _r1 = _mm512_loadu_ps(k1);
                __m512 _r2 = _mm512_loadu_ps(k2);
                __m512 _r3 = _mm512_loadu_ps(k3);
                __m512 _r4 = _mm512_loadu_ps(k4);
                __m512 _r5 = _mm512_loadu_ps(k5);
                __m512 _r6 = _mm512_loadu_ps(k6);
                __m512 _r7 = _mm512_loadu_ps(k7);
                __m512 _r8 = _mm512_loadu_ps(k8);
                __m512 _r9 = _mm512_loadu_ps(k9);
                __m512 _ra = _mm512_loadu_ps(ka);
                __m512 _rb = _mm512_loadu_ps(kb);
                __m512 _rc = _mm512_loadu_ps(kc);
                __m512 _rd = _mm512_loadu_ps(kd);
                __m512 _re = _mm512_loadu_ps(ke);
                __m512 _rf = _mm512_loadu_ps(kf);

                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);

                _mm512_storeu_ps(g0, _r0);
                _mm512_storeu_ps(g0 + 16, _r1);
                _mm512_storeu_ps(g0 + 16 * 2, _r2);
                _mm512_storeu_ps(g0 + 16 * 3, _r3);
                _mm512_storeu_ps(g0 + 16 * 4, _r4);
                _mm512_storeu_ps(g0 + 16 * 5, _r5);
                _mm512_storeu_ps(g0 + 16 * 6, _r6);
                _mm512_storeu_ps(g0 + 16 * 7, _r7);
                _mm512_storeu_ps(g0 + 16 * 8, _r8);
                _mm512_storeu_ps(g0 + 16 * 9, _r9);
                _mm512_storeu_ps(g0 + 16 * 10, _ra);
                _mm512_storeu_ps(g0 + 16 * 11, _rb);
                _mm512_storeu_ps(g0 + 16 * 12, _rc);
                _mm512_storeu_ps(g0 + 16 * 13, _rd);
                _mm512_storeu_ps(g0 + 16 * 14, _re);
                _mm512_storeu_ps(g0 + 16 * 15, _rf);
#endif

                k0 += 16;
                k1 += 16;
                k2 += 16;
                k3 += 16;
                k4 += 16;
                k5 += 16;
                k6 += 16;
                k7 += 16;
                k8 += 16;
                k9 += 16;
                ka += 16;
                kb += 16;
                kc += 16;
                kd += 16;
                ke += 16;
                kf += 16;
                g0 += 256;
            }
            for (; p + 7 < num_input; p += 8)
            {
                // transpose 8x16
#if NCNN_IMPL_FP16S
                __m128i _r0 = _mm256_cvtps_ph(_mm256_loadu_ps(k0), _MM_FROUND_TRUNC);
                __m128i _r1 = _mm256_cvtps_ph(_mm256_loadu_ps(k1), _MM_FROUND_TRUNC);
                __m128i _r2 = _mm256_cvtps_ph(_mm256_loadu_ps(k2), _MM_FROUND_TRUNC);
                __m128i _r3 = _mm256_cvtps_ph(_mm256_loadu_ps(k3), _MM_FROUND_TRUNC);
                __m128i _r4 = _mm256_cvtps_ph(_mm256_loadu_ps(k4), _MM_FROUND_TRUNC);
                __m128i _r5 = _mm256_cvtps_ph(_mm256_loadu_ps(k5), _MM_FROUND_TRUNC);
                __m128i _r6 = _mm256_cvtps_ph(_mm256_loadu_ps(k6), _MM_FROUND_TRUNC);
                __m128i _r7 = _mm256_cvtps_ph(_mm256_loadu_ps(k7), _MM_FROUND_TRUNC);
                __m128i _r8 = _mm256_cvtps_ph(_mm256_loadu_ps(k8), _MM_FROUND_TRUNC);
                __m128i _r9 = _mm256_cvtps_ph(_mm256_loadu_ps(k9), _MM_FROUND_TRUNC);
                __m128i _ra = _mm256_cvtps_ph(_mm256_loadu_ps(ka), _MM_FROUND_TRUNC);
                __m128i _rb = _mm256_cvtps_ph(_mm256_loadu_ps(kb), _MM_FROUND_TRUNC);
                __m128i _rc = _mm256_cvtps_ph(_mm256_loadu_ps(kc), _MM_FROUND_TRUNC);
                __m128i _rd = _mm256_cvtps_ph(_mm256_loadu_ps(kd), _MM_FROUND_TRUNC);
                __m128i _re = _mm256_cvtps_ph(_mm256_loadu_ps(ke), _MM_FROUND_TRUNC);
                __m128i _rf = _mm256_cvtps_ph(_mm256_loadu_ps(kf), _MM_FROUND_TRUNC);

                __m256i _r08 = _mm256_inserti128_si256(_mm256_castsi128_si256(_r0), _r8, 1);
                __m256i _r19 = _mm256_inserti128_si256(_mm256_castsi128_si256(_r1), _r9, 1);
                __m256i _r2a = _mm256_inserti128_si256(_mm256_castsi128_si256(_r2), _ra, 1);
                __m256i _r3b = _mm256_inserti128_si256(_mm256_castsi128_si256(_r3), _rb, 1);
                __m256i _r4c = _mm256_inserti128_si256(_mm256_castsi128_si256(_r4), _rc, 1);
                __m256i _r5d = _mm256_inserti128_si256(_mm256_castsi128_si256(_r5), _rd, 1);
                __m256i _r6e = _mm256_inserti128_si256(_mm256_castsi128_si256(_r6), _re, 1);
                __m256i _r7f = _mm256_inserti128_si256(_mm256_castsi128_si256(_r7), _rf, 1);

                __m256i _tmp0 = _mm256_unpacklo_epi16(_r08, _r19);
                __m256i _tmp1 = _mm256_unpackhi_epi16(_r08, _r19);
                __m256i _tmp2 = _mm256_unpacklo_epi16(_r2a, _r3b);
                __m256i _tmp3 = _mm256_unpackhi_epi16(_r2a, _r3b);
                __m256i _tmp4 = _mm256_unpacklo_epi16(_r4c, _r5d);
                __m256i _tmp5 = _mm256_unpackhi_epi16(_r4c, _r5d);
                __m256i _tmp6 = _mm256_unpacklo_epi16(_r6e, _r7f);
                __m256i _tmp7 = _mm256_unpackhi_epi16(_r6e, _r7f);

                __m256i _tmpg = _mm256_unpacklo_epi32(_tmp0, _tmp2);
                __m256i _tmph = _mm256_unpackhi_epi32(_tmp0, _tmp2);
                __m256i _tmpi = _mm256_unpacklo_epi32(_tmp1, _tmp3);
                __m256i _tmpj = _mm256_unpackhi_epi32(_tmp1, _tmp3);
                __m256i _tmpk = _mm256_unpacklo_epi32(_tmp4, _tmp6);
                __m256i _tmpl = _mm256_unpackhi_epi32(_tmp4, _tmp6);
                __m256i _tmpm = _mm256_unpacklo_epi32(_tmp5, _tmp7);
                __m256i _tmpn = _mm256_unpackhi_epi32(_tmp5, _tmp7);

                _r08 = _mm256_unpacklo_epi64(_tmpg, _tmpk);
                _r19 = _mm256_unpackhi_epi64(_tmpg, _tmpk);
                _r2a = _mm256_unpacklo_epi64(_tmph, _tmpl);
                _r3b = _mm256_unpackhi_epi64(_tmph, _tmpl);
                _r4c = _mm256_unpacklo_epi64(_tmpi, _tmpm);
                _r5d = _mm256_unpackhi_epi64(_tmpi, _tmpm);
                _r6e = _mm256_unpacklo_epi64(_tmpj, _tmpn);
                _r7f = _mm256_unpackhi_epi64(_tmpj, _tmpn);

                _mm256_storeu_si256((__m256i*)g0, _r08);
                _mm256_storeu_si256((__m256i*)(g0 + 16), _r19);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 2), _r2a);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 3), _r3b);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 4), _r4c);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 5), _r5d);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 6), _r6e);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 7), _r7f);
#else
                __m256 _r0 = _mm256_loadu_ps(k0);
                __m256 _r1 = _mm256_loadu_ps(k1);
                __m256 _r2 = _mm256_loadu_ps(k2);
                __m256 _r3 = _mm256_loadu_ps(k3);
                __m256 _r4 = _mm256_loadu_ps(k4);
                __m256 _r5 = _mm256_loadu_ps(k5);
                __m256 _r6 = _mm256_loadu_ps(k6);
                __m256 _r7 = _mm256_loadu_ps(k7);
                __m256 _r8 = _mm256_loadu_ps(k8);
                __m256 _r9 = _mm256_loadu_ps(k9);
                __m256 _ra = _mm256_loadu_ps(ka);
                __m256 _rb = _mm256_loadu_ps(kb);
                __m256 _rc = _mm256_loadu_ps(kc);
                __m256 _rd = _mm256_loadu_ps(kd);
                __m256 _re = _mm256_loadu_ps(ke);
                __m256 _rf = _mm256_loadu_ps(kf);

                transpose8x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);

                _mm256_storeu_ps(g0, _r0);
                _mm256_storeu_ps(g0 + 8, _r1);
                _mm256_storeu_ps(g0 + 8 * 2, _r2);
                _mm256_storeu_ps(g0 + 8 * 3, _r3);
                _mm256_storeu_ps(g0 + 8 * 4, _r4);
                _mm256_storeu_ps(g0 + 8 * 5, _r5);
                _mm256_storeu_ps(g0 + 8 * 6, _r6);
                _mm256_storeu_ps(g0 + 8 * 7, _r7);
                _mm256_storeu_ps(g0 + 8 * 8, _r8);
                _mm256_storeu_ps(g0 + 8 * 9, _r9);
                _mm256_storeu_ps(g0 + 8 * 10, _ra);
                _mm256_storeu_ps(g0 + 8 * 11, _rb);
                _mm256_storeu_ps(g0 + 8 * 12, _rc);
                _mm256_storeu_ps(g0 + 8 * 13, _rd);
                _mm256_storeu_ps(g0 + 8 * 14, _re);
                _mm256_storeu_ps(g0 + 8 * 15, _rf);
#endif

                k0 += 8;
                k1 += 8;
                k2 += 8;
                k3 += 8;
                k4 += 8;
                k5 += 8;
                k6 += 8;
                k7 += 8;
                k8 += 8;
                k9 += 8;
                ka += 8;
                kb += 8;
                kc += 8;
                kd += 8;
                ke += 8;
                kf += 8;
                g0 += 128;
            }
            for (; p < num_input; p++)
            {
#if NCNN_IMPL_FP16S
                g0[0] = float32_to_float16(*k0++);
                g0[1] = float32_to_float16(*k1++);
                g0[2] = float32_to_float16(*k2++);
                g0[3] = float32_to_float16(*k3++);
                g0[4] = float32_to_float16(*k4++);
                g0[5] = float32_to_float16(*k5++);
                g0[6] = float32_to_float16(*k6++);
                g0[7] = float32_to_float16(*k7++);
                g0[8] = float32_to_float16(*k8++);
                g0[9] = float32_to_float16(*k9++);
                g0[10] = float32_to_float16(*ka++);
                g0[11] = float32_to_float16(*kb++);
                g0[12] = float32_to_float16(*kc++);
                g0[13] = float32_to_float16(*kd++);
                g0[14] = float32_to_float16(*ke++);
                g0[15] = float32_to_float16(*kf++);
#else
                g0[0] = *k0++;
                g0[1] = *k1++;
                g0[2] = *k2++;
                g0[3] = *k3++;
                g0[4] = *k4++;
                g0[5] = *k5++;
                g0[6] = *k6++;
                g0[7] = *k7++;
                g0[8] = *k8++;
                g0[9] = *k9++;
                g0[10] = *ka++;
                g0[11] = *kb++;
                g0[12] = *kc++;
                g0[13] = *kd++;
                g0[14] = *ke++;
                g0[15] = *kf++;
#endif
                g0 += 16;
            }
        }
    }
#endif // __AVX512F__

    if (out_elempack == 8)
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

#if NCNN_IMPL_FP16S
        weight_data_tm.create(num_input, num_output / 8, (size_t)16u, 8);
#else
        weight_data_tm.create(num_input, num_output / 8, (size_t)32u, 8);
#endif

        for (int q = 0; q + 7 < num_output; q += 8)
        {
#if NCNN_IMPL_FP16S
            unsigned short* g0 = weight_data_tm.row<unsigned short>(q / 8);
#else
            float* g0 = weight_data_tm.row(q / 8);
#endif

            const float* k0 = weight_data_r2.row(q);
            const float* k1 = weight_data_r2.row(q + 1);
            const float* k2 = weight_data_r2.row(q + 2);
            const float* k3 = weight_data_r2.row(q + 3);
            const float* k4 = weight_data_r2.row(q + 4);
            const float* k5 = weight_data_r2.row(q + 5);
            const float* k6 = weight_data_r2.row(q + 6);
            const float* k7 = weight_data_r2.row(q + 7);

            int p = 0;
#if __AVX512F__
            for (; p + 15 < num_input; p += 16)
            {
                // transpose 16x8
#if NCNN_IMPL_FP16S
                __m256i _r0 = _mm512_cvtps_ph(_mm512_loadu_ps(k0), _MM_FROUND_TRUNC);
                __m256i _r1 = _mm512_cvtps_ph(_mm512_loadu_ps(k1), _MM_FROUND_TRUNC);
                __m256i _r2 = _mm512_cvtps_ph(_mm512_loadu_ps(k2), _MM_FROUND_TRUNC);
                __m256i _r3 = _mm512_cvtps_ph(_mm512_loadu_ps(k3), _MM_FROUND_TRUNC);
                __m256i _r4 = _mm512_cvtps_ph(_mm512_loadu_ps(k4), _MM_FROUND_TRUNC);
                __m256i _r5 = _mm512_cvtps_ph(_mm512_loadu_ps(k5), _MM_FROUND_TRUNC);
                __m256i _r6 = _mm512_cvtps_ph(_mm512_loadu_ps(k6), _MM_FROUND_TRUNC);
                __m256i _r7 = _mm512_cvtps_ph(_mm512_loadu_ps(k7), _MM_FROUND_TRUNC);

                transpose16x8_epi16(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);

                _mm256_storeu_si256((__m256i*)g0, _r0);
                _mm256_storeu_si256((__m256i*)(g0 + 16), _r1);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 2), _r2);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 3), _r3);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 4), _r4);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 5), _r5);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 6), _r6);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 7), _r7);
#else
                __m512 _r0 = _mm512_loadu_ps(k0);
                __m512 _r1 = _mm512_loadu_ps(k1);
                __m512 _r2 = _mm512_loadu_ps(k2);
                __m512 _r3 = _mm512_loadu_ps(k3);
                __m512 _r4 = _mm512_loadu_ps(k4);
                __m512 _r5 = _mm512_loadu_ps(k5);
                __m512 _r6 = _mm512_loadu_ps(k6);
                __m512 _r7 = _mm512_loadu_ps(k7);

                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);

                _mm512_storeu_ps(g0, _r0);
                _mm512_storeu_ps(g0 + 16, _r1);
                _mm512_storeu_ps(g0 + 16 * 2, _r2);
                _mm512_storeu_ps(g0 + 16 * 3, _r3);
                _mm512_storeu_ps(g0 + 16 * 4, _r4);
                _mm512_storeu_ps(g0 + 16 * 5, _r5);
                _mm512_storeu_ps(g0 + 16 * 6, _r6);
                _mm512_storeu_ps(g0 + 16 * 7, _r7);
#endif

                k0 += 16;
                k1 += 16;
                k2 += 16;
                k3 += 16;
                k4 += 16;
                k5 += 16;
                k6 += 16;
                k7 += 16;
                g0 += 128;
            }
#endif // __AVX512F__
            for (; p + 7 < num_input; p += 8)
            {
                // transpose 8x8
#if NCNN_IMPL_FP16S
                __m128i _r0 = _mm256_cvtps_ph(_mm256_loadu_ps(k0), _MM_FROUND_TRUNC);
                __m128i _r1 = _mm256_cvtps_ph(_mm256_loadu_ps(k1), _MM_FROUND_TRUNC);
                __m128i _r2 = _mm256_cvtps_ph(_mm256_loadu_ps(k2), _MM_FROUND_TRUNC);
                __m128i _r3 = _mm256_cvtps_ph(_mm256_loadu_ps(k3), _MM_FROUND_TRUNC);
                __m128i _r4 = _mm256_cvtps_ph(_mm256_loadu_ps(k4), _MM_FROUND_TRUNC);
                __m128i _r5 = _mm256_cvtps_ph(_mm256_loadu_ps(k5), _MM_FROUND_TRUNC);
                __m128i _r6 = _mm256_cvtps_ph(_mm256_loadu_ps(k6), _MM_FROUND_TRUNC);
                __m128i _r7 = _mm256_cvtps_ph(_mm256_loadu_ps(k7), _MM_FROUND_TRUNC);

                transpose8x8_epi16(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);

                _mm_storeu_si128((__m128i*)g0, _r0);
                _mm_storeu_si128((__m128i*)(g0 + 8), _r1);
                _mm_storeu_si128((__m128i*)(g0 + 16), _r2);
                _mm_storeu_si128((__m128i*)(g0 + 24), _r3);
                _mm_storeu_si128((__m128i*)(g0 + 32), _r4);
                _mm_storeu_si128((__m128i*)(g0 + 40), _r5);
                _mm_storeu_si128((__m128i*)(g0 + 48), _r6);
                _mm_storeu_si128((__m128i*)(g0 + 56), _r7);
#else
                __m256 _r0 = _mm256_loadu_ps(k0);
                __m256 _r1 = _mm256_loadu_ps(k1);
                __m256 _r2 = _mm256_loadu_ps(k2);
                __m256 _r3 = _mm256_loadu_ps(k3);
                __m256 _r4 = _mm256_loadu_ps(k4);
                __m256 _r5 = _mm256_loadu_ps(k5);
                __m256 _r6 = _mm256_loadu_ps(k6);
                __m256 _r7 = _mm256_loadu_ps(k7);

                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);

                _mm256_storeu_ps(g0, _r0);
                _mm256_storeu_ps(g0 + 8, _r1);
                _mm256_storeu_ps(g0 + 16, _r2);
                _mm256_storeu_ps(g0 + 24, _r3);
                _mm256_storeu_ps(g0 + 32, _r4);
                _mm256_storeu_ps(g0 + 40, _r5);
                _mm256_storeu_ps(g0 + 48, _r6);
                _mm256_storeu_ps(g0 + 56, _r7);
#endif

                k0 += 8;
                k1 += 8;
                k2 += 8;
                k3 += 8;
                k4 += 8;
                k5 += 8;
                k6 += 8;
                k7 += 8;
                g0 += 64;
            }
            for (; p < num_input; p++)
            {
#if NCNN_IMPL_FP16S
                g0[0] = float32_to_float16(*k0++);
                g0[1] = float32_to_float16(*k1++);
                g0[2] = float32_to_float16(*k2++);
                g0[3] = float32_to_float16(*k3++);
                g0[4] = float32_to_float16(*k4++);
                g0[5] = float32_to_float16(*k5++);
                g0[6] = float32_to_float16(*k6++);
                g0[7] = float32_to_float16(*k7++);
#else
                g0[0] = *k0++;
                g0[1] = *k1++;
                g0[2] = *k2++;
                g0[3] = *k3++;
                g0[4] = *k4++;
                g0[5] = *k5++;
                g0[6] = *k6++;
                g0[7] = *k7++;
#endif
                g0 += 8;
            }
        }
    }
#endif // __AVX__

    if (out_elempack == 4)
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

#if NCNN_IMPL_FP16S
        weight_data_tm.create(num_input, num_output / 4, (size_t)8u, 4);
#else
        weight_data_tm.create(num_input, num_output / 4, (size_t)16u, 4);
#endif

        for (int q = 0; q + 3 < num_output; q += 4)
        {
#if NCNN_IMPL_FP16S
            unsigned short* g0 = weight_data_tm.row<unsigned short>(q / 4);
#else
            float* g0 = weight_data_tm.row(q / 4);
#endif

            const float* k0 = weight_data_r2.row(q);
            const float* k1 = weight_data_r2.row(q + 1);
            const float* k2 = weight_data_r2.row(q + 2);
            const float* k3 = weight_data_r2.row(q + 3);

            int p = 0;
            for (; p + 3 < num_input; p += 4)
            {
                // transpose 4x4
                __m128 _r0 = _mm_loadu_ps(k0);
                __m128 _r1 = _mm_loadu_ps(k1);
                __m128 _r2 = _mm_loadu_ps(k2);
                __m128 _r3 = _mm_loadu_ps(k3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
#if NCNN_IMPL_FP16S
                __m256 _r01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_r0), _r1, 1);
                __m256 _r23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_r2), _r3, 1);
                __m128i _r01_fp16 = _mm256_cvtps_ph(_r01, _MM_FROUND_TRUNC);
                __m128i _r23_fp16 = _mm256_cvtps_ph(_r23, _MM_FROUND_TRUNC);
                _mm_storeu_si128((__m128i*)g0, _r01_fp16);
                _mm_storeu_si128((__m128i*)(g0 + 8), _r23_fp16);
#else
                _mm_storeu_ps(g0, _r0);
                _mm_storeu_ps(g0 + 4, _r1);
                _mm_storeu_ps(g0 + 8, _r2);
                _mm_storeu_ps(g0 + 12, _r3);
#endif

                k0 += 4;
                k1 += 4;
                k2 += 4;
                k3 += 4;
                g0 += 16;
            }
            for (; p < num_input; p++)
            {
#if NCNN_IMPL_FP16S
                g0[0] = float32_to_float16(*k0++);
                g0[1] = float32_to_float16(*k1++);
                g0[2] = float32_to_float16(*k2++);
                g0[3] = float32_to_float16(*k3++);
#else
                g0[0] = *k0++;
                g0[1] = *k1++;
                g0[2] = *k2++;
                g0[3] = *k3++;
#endif
                g0 += 4;
            }
        }
    }
#endif // __SSE2__

    if (out_elempack == 1)
    {
#if NCNN_IMPL_FP16S
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);
        ncnn::cast_float32_to_float16(weight_data_r2, weight_data_tm, opt);
#else
        weight_data_tm = weight_data;
#endif
    }
#endif // NCNN_RUNTIME_CPU
}